

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t * pm_slashskip_w(wchar_t *s)

{
  bool bVar1;
  wchar_t *s_local;
  
  s_local = s;
  while( true ) {
    bVar1 = true;
    if ((*s_local != L'/') &&
       (((*s_local != L'.' || (bVar1 = true, s_local[1] != L'/')) &&
        (bVar1 = false, *s_local == L'.')))) {
      bVar1 = s_local[1] == L'\0';
    }
    if (!bVar1) break;
    s_local = s_local + 1;
  }
  return s_local;
}

Assistant:

static const wchar_t *
pm_slashskip_w(const wchar_t *s) {
	while ((*s == L'/')
	    || (s[0] == L'.' && s[1] == L'/')
	    || (s[0] == L'.' && s[1] == L'\0'))
		++s;
	return (s);
}